

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinc_resampler.cc
# Opt level: O0

void __thiscall webrtc::SincResampler::InitializeKernel(SincResampler *this)

{
  float fVar1;
  size_t __i;
  type pfVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double local_88;
  float local_5c;
  float local_54;
  float window;
  float x;
  float pre_sinc;
  size_t idx;
  size_t i;
  ulong uStack_20;
  float subsample_offset;
  size_t offset_idx;
  double sinc_scale_factor;
  SincResampler *this_local;
  
  dVar4 = anon_unknown_3::SincScaleFactor(this->io_sample_rate_ratio_);
  for (uStack_20 = 0; uStack_20 < 0x21; uStack_20 = uStack_20 + 1) {
    local_54 = (float)uStack_20;
    for (idx = 0; idx < 0x20; idx = idx + 1) {
      __i = idx + uStack_20 * 0x20;
      fVar1 = ((float)((int)idx + -0x10) - local_54 / 32.0) * 3.1415927;
      pfVar2 = std::unique_ptr<float[],_webrtc::AlignedFreeDeleter>::operator[]
                         (&this->kernel_pre_sinc_storage_,__i);
      *pfVar2 = fVar1;
      local_5c = (float)idx;
      fVar3 = (local_5c - local_54 / 32.0) / 32.0;
      dVar5 = cos((double)fVar3 * 6.283185307179586);
      dVar6 = cos((double)fVar3 * 12.566370614359172);
      fVar3 = (float)(dVar6 * 0.08 + dVar5 * -0.5 + 0.42);
      pfVar2 = std::unique_ptr<float[],_webrtc::AlignedFreeDeleter>::operator[]
                         (&this->kernel_window_storage_,__i);
      *pfVar2 = fVar3;
      if ((fVar1 != 0.0) || (local_88 = dVar4, NAN(fVar1))) {
        dVar5 = sin(dVar4 * (double)fVar1);
        local_88 = dVar5 / (double)fVar1;
      }
      pfVar2 = std::unique_ptr<float[],_webrtc::AlignedFreeDeleter>::operator[]
                         (&this->kernel_storage_,__i);
      *pfVar2 = (float)((double)fVar3 * local_88);
    }
  }
  return;
}

Assistant:

void SincResampler::InitializeKernel() {
  // Blackman window parameters.
  static const double kAlpha = 0.16;
  static const double kA0 = 0.5 * (1.0 - kAlpha);
  static const double kA1 = 0.5;
  static const double kA2 = 0.5 * kAlpha;

  // Generates a set of windowed sinc() kernels.
  // We generate a range of sub-sample offsets from 0.0 to 1.0.
  const double sinc_scale_factor = SincScaleFactor(io_sample_rate_ratio_);
  for (size_t offset_idx = 0; offset_idx <= kKernelOffsetCount; ++offset_idx) {
    const float subsample_offset =
        static_cast<float>(offset_idx) / kKernelOffsetCount;

    for (size_t i = 0; i < kKernelSize; ++i) {
      const size_t idx = i + offset_idx * kKernelSize;
      const float pre_sinc = static_cast<float>(M_PI *
          (static_cast<int>(i) - static_cast<int>(kKernelSize / 2) -
           subsample_offset));
      kernel_pre_sinc_storage_[idx] = pre_sinc;

      // Compute Blackman window, matching the offset of the sinc().
      const float x = (i - subsample_offset) / kKernelSize;
      const float window = static_cast<float>(kA0 - kA1 * cos(2.0 * M_PI * x) +
          kA2 * cos(4.0 * M_PI * x));
      kernel_window_storage_[idx] = window;

      // Compute the sinc with offset, then window the sinc() function and store
      // at the correct offset.
      kernel_storage_[idx] = static_cast<float>(window *
          ((pre_sinc == 0) ?
              sinc_scale_factor :
              (sin(sinc_scale_factor * pre_sinc) / pre_sinc)));
    }
  }
}